

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestParseGenerate3(UnitTest *this)

{
  bool result;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  char *local_1a0 [4];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  result = runtest<char>("test3.ini","test3.output",
                         (basic_ostream<char,_std::char_traits<char>_> *)local_180);
  Assert::IsTrue(result);
  std::__cxx11::stringbuf::str();
  Logger::WriteMessage(local_1a0[0]);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

TEST_METHOD(TestParseGenerate3)
		{
			std::basic_ostringstream<char> os;
			Assert::IsTrue(runtest<char>("test3.ini", "test3.output", os));
			Logger::WriteMessage(os.str().c_str());
		}